

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O1

void receive_poll(PtTimestamp timestamp,void *userData)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uchar *puVar6;
  char *__s;
  uint uVar7;
  PmEvent event;
  PmEvent local_20;
  
  if (receive_poll_running != '\x01') {
    return;
  }
  uVar7 = 0;
  do {
    iVar1 = Pm_Read(receive_msg_midi_in,&local_20,1);
    if (iVar1 == 0) {
      return;
    }
    if (uVar7 != 0xf7) {
      uVar2 = (ulong)receive_msg_index;
      uVar5 = 0x3ff;
      if (0x3ff < receive_msg_index) {
        uVar5 = (ulong)(uint)receive_msg_index;
      }
      iVar1 = 0;
      uVar3 = 0;
      do {
        uVar7 = local_20.message >> ((byte)uVar3 & 0x1f);
        receive_msg[uVar2] = (uchar)uVar7;
        if (uVar5 == uVar2) {
          receive_msg_index = (receive_msg_index - iVar1) + 1;
          __s = "error: incoming sysex too long";
          goto LAB_00103cd3;
        }
        uVar7 = uVar7 & 0xff;
        iVar1 = iVar1 + -1;
        if (0x17 < uVar3) break;
        uVar3 = uVar3 + 8;
        uVar2 = uVar2 + 1;
      } while (uVar7 != 0xf7);
      receive_msg_index = receive_msg_index - iVar1;
    }
  } while (uVar7 != 0xf7);
  if (receive_msg_length == 0) {
    receive_msg_length = receive_msg_index;
  }
  if (receive_msg_length == receive_msg_index) {
    if (receive_msg[0] == 0xf0) {
      lVar4 = 0;
      puVar6 = receive_msg;
      iVar1 = 0;
      do {
        puVar6 = puVar6 + 1;
        iVar1 = iVar1 + ((uint)*puVar6 << ((byte)lVar4 & 0x1f));
        lVar4 = lVar4 + 7;
      } while (lVar4 != 0x23);
      if (receive_msg_count == -1) {
        receive_msg_count = iVar1;
        receive_msg_messages = iVar1;
      }
      if (receive_msg_count == iVar1) {
        if (7 < receive_msg_index) {
          uVar2 = 6;
          __s = "error: incoming sysex has bad data";
          do {
            if (((uint)uVar2 & 0x7f) != (uint)receive_msg[uVar2]) goto LAB_00103cd3;
            uVar2 = uVar2 + 1;
          } while (receive_msg_index - 1 != uVar2);
        }
        if (*(char *)((long)&receive_msg_midi_in + (long)receive_msg_length + 7) != -9) {
          receive_msg_error = 1;
          return;
        }
        receive_msg_index = 0;
        receive_msg_count = receive_msg_count + -1;
        return;
      }
      __s = "error: incoming sysex has wrong count";
    }
    else {
      __s = "error: incoming sysex missing status byte";
    }
  }
  else {
    __s = "error: incoming sysex wrong length";
  }
LAB_00103cd3:
  puts(__s);
  receive_msg_error = 1;
  return;
}

Assistant:

void receive_poll(PtTimestamp timestamp, void *userData)
{
    PmError count;
    PmEvent event;
    int shift;
    int data = 0;
    int i;
    
    if (!receive_poll_running) return; /* wait until midi device is opened */
    shift = 0;
    while (data != MIDI_EOX) {
        count = Pm_Read(receive_msg_midi_in, &event, 1);
        if (count == 0) return;

        /* compare 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            receive_msg[receive_msg_index++] = data = 
                (event.message >> shift) & 0xFF;
            if (receive_msg_index >= MAX_MSG_LEN) {
                printf("error: incoming sysex too long\n");
                goto error;
            }
        }
    }
    /* check the message */
    if (receive_msg_length == 0) {
        receive_msg_length = receive_msg_index;
    }
    if (receive_msg_length != receive_msg_index) {
        printf("error: incoming sysex wrong length\n");
        goto error;
    }
    if (receive_msg[0] != MIDI_SYSEX) {
        printf("error: incoming sysex missing status byte\n");
        goto error;
    }
    /* get and check the count */
    count = 0;
    for (i = 0; i < 5; i++) {
        count += receive_msg[i + 1] << (7 * i);
    }
    if (receive_msg_count == -1) {
        receive_msg_count = count;
        receive_msg_messages = count;
    }
    if (receive_msg_count != count) {
        printf("error: incoming sysex has wrong count\n");
        goto error;
    }
    for (i = 6; i < receive_msg_index - 1; i++) {
        if (receive_msg[i] != i % 128) {
            printf("error: incoming sysex has bad data\n");
            goto error;
        }
    }
    if (receive_msg[receive_msg_length - 1] != MIDI_EOX) goto error;
    receive_msg_index = 0; /* get ready for next message */
    receive_msg_count--;
    return;
 error:
    receive_msg_error = 1;
    return;
}